

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

upb_test_SubMessageHasRequired *
upb_test_SubMessageHasRequired_parse_ex
          (char *buf,size_t size,upb_ExtensionRegistry *extreg,int options,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  upb_test_SubMessageHasRequired *ret;
  upb_Arena *arena_local;
  int options_local;
  upb_ExtensionRegistry *extreg_local;
  size_t size_local;
  char *buf_local;
  
  buf_local = (char *)upb_test_SubMessageHasRequired_new(arena);
  if ((upb_test_SubMessageHasRequired *)buf_local == (upb_test_SubMessageHasRequired *)0x0) {
    buf_local = (char *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,(upb_Message *)buf_local,&upb_0test__SubMessageHasRequired_msg_init,
                       extreg,options,arena);
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      buf_local = (char *)0x0;
    }
  }
  return (upb_test_SubMessageHasRequired *)buf_local;
}

Assistant:

UPB_INLINE upb_test_SubMessageHasRequired* upb_test_SubMessageHasRequired_parse_ex(const char* buf, size_t size,
                           const upb_ExtensionRegistry* extreg,
                           int options, upb_Arena* arena) {
  upb_test_SubMessageHasRequired* ret = upb_test_SubMessageHasRequired_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &upb_0test__SubMessageHasRequired_msg_init, extreg, options,
                 arena) != kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}